

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t __thiscall
duckdb::RowMatcher::Match
          (RowMatcher *this,DataChunk *lhs,vector<duckdb::TupleDataVectorFormat,_true> *lhs_formats,
          SelectionVector *sel,idx_t count,TupleDataLayout *rhs_layout,Vector *rhs_row_locations,
          SelectionVector *no_match_sel,idx_t *no_match_count,vector<unsigned_long,_true> *columns)

{
  size_type __n;
  match_function_t p_Var1;
  const_reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  idx_t fun_idx;
  ulong __n_00;
  
  for (__n_00 = 0;
      __n_00 < (ulong)((long)(this->match_functions).
                             super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>
                             .
                             super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->match_functions).
                             super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>
                             .
                             super__Vector_base<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); __n_00 = __n_00 + 1) {
    pvVar2 = vector<unsigned_long,_true>::get<true>(columns,__n_00);
    __n = *pvVar2;
    pvVar3 = vector<duckdb::MatchFunction,_true>::get<true>(&this->match_functions,__n_00);
    p_Var1 = pvVar3->function;
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&lhs->data,__n);
    pvVar5 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>(lhs_formats,__n);
    count = (*p_Var1)(pvVar4,pvVar5,sel,count,rhs_layout,rhs_row_locations,__n,
                      &pvVar3->child_functions,no_match_sel,no_match_count);
  }
  return count;
}

Assistant:

idx_t RowMatcher::Match(DataChunk &lhs, const vector<TupleDataVectorFormat> &lhs_formats, SelectionVector &sel,
                        idx_t count, const TupleDataLayout &rhs_layout, Vector &rhs_row_locations,
                        SelectionVector *no_match_sel, idx_t &no_match_count, const vector<column_t> &columns) {
	D_ASSERT(!match_functions.empty());

	// The column_ids must have the same size as the match_functions vector
	D_ASSERT(columns.size() == match_functions.size());

	// The largest column_id must be smaller than the number columns to not cause an out-of-bounds error
	D_ASSERT(*max_element(columns.begin(), columns.end()) < lhs.ColumnCount());

	for (idx_t fun_idx = 0; fun_idx < match_functions.size(); fun_idx++) {
		// if we only care about specific columns, we need to use the column_ids to get the correct column index
		// otherwise, we just use the fun_idx
		const auto col_idx = columns[fun_idx];

		const auto &match_function = match_functions[fun_idx];
		count =
		    match_function.function(lhs.data[col_idx], lhs_formats[col_idx], sel, count, rhs_layout, rhs_row_locations,
		                            col_idx, match_function.child_functions, no_match_sel, no_match_count);
	}
	return count;
}